

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_visitor.cpp
# Opt level: O2

void __thiscall delete_visitor::visit(delete_visitor *this,MethodDeclaration *ptr)

{
  string *this_00;
  
  (**(ptr->type->super_Base)._vptr_Base)(ptr->type,this);
  (**(ptr->args->super_Base)._vptr_Base)(ptr->args,this);
  (**(ptr->body->super_Base)._vptr_Base)(ptr->body,this);
  this_00 = ptr->name;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
  }
  operator_delete(this_00,0x20);
  (*(ptr->super_Declaration).super_Base._vptr_Base[2])(ptr);
  return;
}

Assistant:

void delete_visitor::visit(MethodDeclaration* ptr) {


    ptr->type->accept(this);
    ptr->args->accept(this);
    ptr->body->accept(this);
    //name
    delete ptr->name;
    delete ptr;
}